

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O3

int cd_match_data_init(parser_info *info,char **attr)

{
  coda_detection_rule *detection_rule;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  coda_detection_rule_entry *pcVar6;
  char *pcVar7;
  coda_expression *pcVar8;
  char *pcVar9;
  size_t sVar10;
  char *pcVar11;
  coda_expression *op2;
  undefined8 uVar12;
  char **ppcVar13;
  node_info *pnVar14;
  char *pcVar15;
  char *__dest;
  char *pcVar16;
  char *local_38;
  
  pnVar14 = info->node;
  pnVar14->free_data = coda_detection_rule_entry_delete;
  pcVar7 = *attr;
  if (pcVar7 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    ppcVar13 = attr + 2;
    pcVar9 = (char *)0x0;
    pcVar15 = pcVar7;
    do {
      iVar5 = strcmp(pcVar15,"offset");
      if (iVar5 == 0) {
        pcVar9 = ppcVar13[-1];
        break;
      }
      pcVar15 = *ppcVar13;
      ppcVar13 = ppcVar13 + 2;
    } while (pcVar15 != (char *)0x0);
    ppcVar13 = attr + 2;
    do {
      iVar5 = strcmp(pcVar7,"path");
      if (iVar5 == 0) {
        pcVar7 = ppcVar13[-1];
        if (pcVar7 != (char *)0x0) {
          if (pcVar9 != (char *)0x0) {
            coda_set_error(-400,"providing both \'path\' and \'offset\' attributes is not allowed");
            return -1;
          }
          detection_rule = (coda_detection_rule *)pnVar14->parent->data;
          pcVar9 = strdup(pcVar7);
          if (pcVar9 == (char *)0x0) {
            uVar12 = 0x8ca;
            goto LAB_0015972c;
          }
          sVar10 = strlen(pcVar7);
          pcVar7 = (char *)malloc(sVar10 + 6);
          if (pcVar7 == (char *)0x0) {
            uVar12 = 0x8d6;
            goto LAB_0015972c;
          }
          *pcVar7 = '\0';
          cVar4 = *pcVar9;
          pcVar15 = pcVar7;
          pcVar16 = pcVar9;
          if (cVar4 == '/') {
            *pcVar7 = '/';
            pcVar15 = pcVar7 + 1;
            pcVar16 = pcVar9 + 1;
            cVar4 = pcVar9[1];
          }
          if (cVar4 == '@') {
            *pcVar15 = '@';
            pcVar15 = pcVar15 + 1;
            pcVar16 = pcVar16 + 1;
          }
          bVar3 = false;
          bVar1 = cVar4 == '@';
          goto LAB_001597b8;
        }
        break;
      }
      pcVar7 = *ppcVar13;
      ppcVar13 = ppcVar13 + 2;
    } while (pcVar7 != (char *)0x0);
  }
  pcVar6 = coda_detection_rule_entry_new((char *)0x0);
  pnVar14 = info->node;
  pnVar14->data = pcVar6;
  if (pcVar6 == (coda_detection_rule_entry *)0x0) {
    return -1;
  }
  if (pcVar9 != (char *)0x0) {
    pcVar7 = strdup(pcVar9);
    if (pcVar7 == (char *)0x0) {
      uVar12 = 0x9a0;
LAB_0015972c:
      coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                     ,uVar12);
      return -1;
    }
    pcVar8 = coda_expression_new(expr_constant_integer,pcVar7,(coda_expression *)0x0,
                                 (coda_expression *)0x0,(coda_expression *)0x0,
                                 (coda_expression *)0x0);
    if (pcVar8 == (coda_expression *)0x0) {
      coda_set_error(-400,"invalid \'offset\' attribute value \'%s\'",pcVar9);
      return -1;
    }
    iVar5 = coda_detection_rule_entry_set_expression
                      ((coda_detection_rule_entry *)info->node->data,pcVar8);
    if (iVar5 != 0) {
      coda_expression_delete(pcVar8);
      return -1;
    }
    pnVar14 = info->node;
  }
LAB_001599cd:
  pnVar14->expect_char_data = 1;
  pnVar14->finalise_element = cd_match_data_finalise;
  return 0;
LAB_001597b8:
  do {
    __dest = pcVar15;
    if (bVar3) {
      cVar4 = '@';
      if (!bVar1) {
        cVar4 = '/';
      }
      *pcVar15 = cVar4;
      __dest = pcVar15 + 1;
    }
    if (*pcVar16 == '{') {
      local_38 = pcVar16 + 1;
      for (pcVar16 = pcVar16 + 2; pcVar16[-1] != '}'; pcVar16 = pcVar16 + 1) {
        if (pcVar16[-1] == '\0') {
          pcVar15 = detection_rule->product_definition->name;
          pcVar16 = "xml detection rule for \'%s\' has invalid path value";
          goto LAB_00159a28;
        }
      }
      pcVar16[-1] = '\0';
      pcVar15 = pcVar16;
    }
    else {
      local_38 = (char *)0x0;
      pcVar15 = pcVar16;
    }
    do {
      pcVar11 = pcVar16;
      pcVar16 = pcVar11 + 1;
      cVar4 = *pcVar11;
      if ((cVar4 == '\0') || (cVar4 == '/')) break;
    } while (cVar4 != '@');
    *pcVar11 = '\0';
    pcVar11 = coda_identifier_from_name(pcVar15,(hashtable *)0x0);
    if (pcVar11 == (char *)0x0) {
LAB_00159af9:
      free(pcVar7);
      goto LAB_00159b06;
    }
    strcpy(__dest,pcVar11);
    sVar10 = strlen(pcVar11);
    pcVar15 = __dest + sVar10;
    free(pcVar11);
    if (local_38 != (char *)0x0) {
      pcVar8 = coda_expression_new(expr_goto_here,(char *)0x0,(coda_expression *)0x0,
                                   (coda_expression *)0x0,(coda_expression *)0x0,
                                   (coda_expression *)0x0);
      if ((pcVar8 != (coda_expression *)0x0) &&
         (pcVar8 = coda_expression_new(expr_string,(char *)0x0,pcVar8,(coda_expression *)0x0,
                                       (coda_expression *)0x0,(coda_expression *)0x0),
         pcVar8 != (coda_expression *)0x0)) {
        pcVar11 = strdup(local_38);
        if (pcVar11 == (char *)0x0) {
          coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                         ,0x93c);
          coda_expression_delete(pcVar8);
          free(pcVar7);
          free(pcVar9);
          return -1;
        }
        op2 = coda_expression_new(expr_constant_string,pcVar11,(coda_expression *)0x0,
                                  (coda_expression *)0x0,(coda_expression *)0x0,
                                  (coda_expression *)0x0);
        if (op2 != (coda_expression *)0x0) {
          pcVar8 = coda_expression_new(expr_equal,(char *)0x0,pcVar8,op2,(coda_expression *)0x0,
                                       (coda_expression *)0x0);
          if (pcVar8 == (coda_expression *)0x0) goto LAB_00159af9;
          builtin_strncpy(__dest + sVar10,"@xmlns",7);
          pcVar6 = coda_detection_rule_entry_new(pcVar7);
          *pcVar15 = '\0';
          if (pcVar6 != (coda_detection_rule_entry *)0x0) {
            iVar5 = coda_detection_rule_entry_set_expression(pcVar6,pcVar8);
            if (iVar5 == 0) {
              iVar5 = coda_detection_rule_add_entry(detection_rule,pcVar6);
              if (iVar5 == 0) goto LAB_00159975;
              coda_detection_rule_entry_delete(pcVar6);
              goto LAB_00159af9;
            }
            coda_detection_rule_entry_delete(pcVar6);
          }
        }
        coda_expression_delete(pcVar8);
      }
      goto LAB_00159af9;
    }
LAB_00159975:
    if (cVar4 == '\0') {
      free(pcVar9);
      pcVar6 = coda_detection_rule_entry_new(pcVar7);
      pnVar14 = info->node;
      pnVar14->data = pcVar6;
      free(pcVar7);
      if (pnVar14->data == (void *)0x0) {
        return -1;
      }
      goto LAB_001599cd;
    }
    bVar3 = true;
    bVar2 = !bVar1;
    bVar1 = cVar4 == '@';
  } while (bVar2);
  pcVar15 = detection_rule->product_definition->name;
  pcVar16 = "xml detection rule for \'%s\' has invalid path (attribute should be last item in path)"
  ;
LAB_00159a28:
  coda_set_error(-100,pcVar16,pcVar15);
  free(pcVar7);
LAB_00159b06:
  free(pcVar9);
  return -1;
}

Assistant:

static int cd_match_data_init(parser_info *info, const char **attr)
{
    const char *offset_string;
    const char *path;
    coda_expression *expr;
    char *string_value;

    info->node->free_data = (free_data_handler)coda_detection_rule_entry_delete;

    offset_string = get_attribute_value(attr, "offset");
    path = get_attribute_value(attr, "path");

    if (path == NULL)
    {
        info->node->data = coda_detection_rule_entry_new(NULL);
        if (info->node->data == NULL)
        {
            return -1;
        }
    }
    if (offset_string != NULL)
    {
        if (path != NULL)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "providing both 'path' and 'offset' attributes is not allowed");
            return -1;
        }
        string_value = strdup(offset_string);
        if (string_value == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                           __LINE__);
            return -1;
        }
        expr = coda_expression_new(expr_constant_integer, string_value, NULL, NULL, NULL, NULL);
        if (expr == NULL)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid 'offset' attribute value '%s'", offset_string);
            return -1;
        }
        if (coda_detection_rule_entry_set_expression((coda_detection_rule_entry *)info->node->data, expr) != 0)
        {
            coda_expression_delete(expr);
            return -1;
        }
    }
    else if (path != NULL)
    {
        if (add_detection_rule_entry_for_path((coda_detection_rule *)info->node->parent->data, path, &string_value) !=
            0)
        {
            return -1;
        }
        info->node->data = coda_detection_rule_entry_new(string_value);
        free(string_value);
        if (info->node->data == NULL)
        {
            return -1;
        }
    }

    info->node->expect_char_data = 1;
    info->node->finalise_element = cd_match_data_finalise;

    return 0;
}